

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkClosure(cmGeneratorTarget *this,string *config,LinkClosure *lc)

{
  string *__lhs;
  cmTarget *pcVar1;
  bool bVar2;
  bool bVar3;
  cmValue cVar4;
  ostream *poVar5;
  string *psVar6;
  LinkClosure *this_00;
  allocator<char> local_202;
  allocator<char> local_201;
  string local_200;
  LinkClosure linkClosure_1;
  LinkClosure linkClosure;
  
  linkClosure.LinkerLanguage._M_dataplus._M_p = (pointer)&linkClosure.LinkerLanguage.field_2;
  linkClosure.LinkerLanguage._M_string_length = 0;
  linkClosure.LinkerLanguage.field_2._M_local_buf[0] = '\0';
  linkClosure.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  linkClosure.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  linkClosure.Languages.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __lhs = &this->LinkerLanguage;
  std::__cxx11::string::_M_assign((string *)&linkClosure);
  pcVar1 = this->Target;
  std::__cxx11::string::string<std::allocator<char>>((string *)&linkClosure_1,"HAS_CXX",&local_201);
  cVar4 = cmTarget::GetProperty(pcVar1,&linkClosure_1.LinkerLanguage);
  if (cVar4.Value == (string *)0x0) {
    pcVar1 = this->Target;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"LINKER_LANGUAGE",&local_202);
    psVar6 = cmTarget::GetSafeProperty(pcVar1,&local_200);
    bVar3 = psVar6->_M_string_length == 0;
    std::__cxx11::string::~string((string *)&local_200);
  }
  else {
    bVar3 = false;
  }
  std::__cxx11::string::~string((string *)&linkClosure_1);
  bVar2 = ComputeLinkClosure(this,config,&linkClosure,false);
  std::__cxx11::string::_M_assign((string *)__lhs);
  if ((bVar3 & bVar2) == 0) {
    this_00 = &linkClosure;
    LinkClosure::operator=(lc,this_00);
  }
  else {
    LinkClosure::~LinkClosure(&linkClosure);
    linkClosure_1.LinkerLanguage._M_dataplus._M_p = (pointer)&linkClosure_1.LinkerLanguage.field_2;
    linkClosure_1.LinkerLanguage._M_string_length = 0;
    linkClosure_1.LinkerLanguage.field_2._M_local_buf[0] = '\0';
    linkClosure_1.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkClosure_1.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkClosure_1.Languages.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ComputeLinkClosure(this,config,&linkClosure_1,true);
    LinkClosure::operator=(lc,&linkClosure_1);
    bVar3 = std::operator!=(__lhs,&lc->LinkerLanguage);
    if (bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&linkClosure);
      poVar5 = std::operator<<((ostream *)&linkClosure,
                               "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> changes\nthe linker language for target \""
                              );
      psVar6 = GetName_abi_cxx11_(this);
      poVar5 = std::operator<<(poVar5,(string *)psVar6);
      poVar5 = std::operator<<(poVar5,"\" (from \'");
      poVar5 = std::operator<<(poVar5,(string *)__lhs);
      poVar5 = std::operator<<(poVar5,"\' to \'");
      poVar5 = std::operator<<(poVar5,(string *)lc);
      std::operator<<(poVar5,"\') which is invalid.");
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_200);
      std::__cxx11::string::~string((string *)&local_200);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&linkClosure);
    }
    this_00 = &linkClosure_1;
  }
  LinkClosure::~LinkClosure(this_00);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkClosure(const std::string& config,
                                           LinkClosure& lc) const
{
  bool secondPass = false;

  {
    LinkClosure linkClosure;
    linkClosure.LinkerLanguage = this->LinkerLanguage;

    bool hasHardCodedLinkerLanguage = this->Target->GetProperty("HAS_CXX") ||
      !this->Target->GetSafeProperty("LINKER_LANGUAGE").empty();

    // Get languages built in this target.
    secondPass = this->ComputeLinkClosure(config, linkClosure, false) &&
      !hasHardCodedLinkerLanguage;
    this->LinkerLanguage = linkClosure.LinkerLanguage;
    if (!secondPass) {
      lc = std::move(linkClosure);
    }
  }

  if (secondPass) {
    LinkClosure linkClosure;

    this->ComputeLinkClosure(config, linkClosure, secondPass);
    lc = std::move(linkClosure);

    // linker language must not be changed between the two passes
    if (this->LinkerLanguage != lc.LinkerLanguage) {
      std::ostringstream e;
      e << "Evaluation of $<LINK_LANGUAGE:...> or $<LINK_LAND_AND_ID:...> "
           "changes\nthe linker language for target \""
        << this->GetName() << "\" (from '" << this->LinkerLanguage << "' to '"
        << lc.LinkerLanguage << "') which is invalid.";
      cmSystemTools::Error(e.str());
    }
  }
}